

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall
VmaAllocator_T::GetAllocationInfo
          (VmaAllocator_T *this,VmaAllocation hAllocation,VmaAllocationInfo *pAllocationInfo)

{
  VmaBlockMetadata *pVVar1;
  char *pcVar2;
  int iVar3;
  undefined4 extraout_var;
  VkDeviceMemory pVVar5;
  void *pvVar6;
  VkDeviceSize VVar4;
  
  pAllocationInfo->memoryType = hAllocation->m_MemoryTypeIndex;
  if (hAllocation->m_Type == '\x01') {
    pAllocationInfo->deviceMemory = ((hAllocation->field_0).m_BlockAllocation.m_Block)->m_hMemory;
    pVVar1 = ((hAllocation->field_0).m_BlockAllocation.m_Block)->m_pMetadata;
    iVar3 = (*pVVar1->_vptr_VmaBlockMetadata[9])
                      (pVVar1,(hAllocation->field_0).m_BlockAllocation.m_AllocHandle);
    VVar4 = CONCAT44(extraout_var,iVar3);
  }
  else {
    if (hAllocation->m_Type == '\x02') {
      pVVar5 = (VkDeviceMemory)(hAllocation->field_0).m_BlockAllocation.m_AllocHandle;
    }
    else {
      pVVar5 = (VkDeviceMemory)0x0;
    }
    pAllocationInfo->deviceMemory = pVVar5;
    VVar4 = 0;
  }
  pAllocationInfo->offset = VVar4;
  pAllocationInfo->size = hAllocation->m_Size;
  pvVar6 = VmaAllocation_T::GetMappedData(hAllocation);
  pAllocationInfo->pMappedData = pvVar6;
  pcVar2 = hAllocation->m_pName;
  pAllocationInfo->pUserData = hAllocation->m_pUserData;
  pAllocationInfo->pName = pcVar2;
  return;
}

Assistant:

void VmaAllocator_T::GetAllocationInfo(VmaAllocation hAllocation, VmaAllocationInfo* pAllocationInfo)
{
    pAllocationInfo->memoryType = hAllocation->GetMemoryTypeIndex();
    pAllocationInfo->deviceMemory = hAllocation->GetMemory();
    pAllocationInfo->offset = hAllocation->GetOffset();
    pAllocationInfo->size = hAllocation->GetSize();
    pAllocationInfo->pMappedData = hAllocation->GetMappedData();
    pAllocationInfo->pUserData = hAllocation->GetUserData();
    pAllocationInfo->pName = hAllocation->GetName();
}